

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O2

ON_Linetype * __thiscall ON_Linetype::operator=(ON_Linetype *this,ON_Linetype *other)

{
  uchar uVar1;
  LineCapStyle LVar2;
  LineJoinStyle LVar3;
  
  if (this != other) {
    ON_ModelComponent::operator=(&this->super_ON_ModelComponent,&other->super_ON_ModelComponent);
    uVar1 = other->m_is_locked_bits;
    LVar2 = other->m_cap_style;
    LVar3 = other->m_join_style;
    this->m_is_set_bits = other->m_is_set_bits;
    this->m_is_locked_bits = uVar1;
    this->m_cap_style = LVar2;
    this->m_join_style = LVar3;
    this->m_width = other->m_width;
    this->m_width_units = other->m_width_units;
    ON_LinetypePrivate::operator=(this->m_private,other->m_private);
  }
  return this;
}

Assistant:

ON_Linetype& ON_Linetype::operator=(const ON_Linetype& other)
{
  if (this != &other)
  {
    ON_ModelComponent::operator=(other);
    m_is_set_bits = other.m_is_set_bits;
    m_is_locked_bits = other.m_is_locked_bits;
    m_cap_style = other.m_cap_style;
    m_join_style = other.m_join_style;
    m_width = other.m_width;
    m_width_units = other.m_width_units;
    *m_private = *other.m_private;
  }
  return *this;
}